

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function-c.cpp
# Opt level: O3

void __thiscall duckdb::CTableBindData::~CTableBindData(CTableBindData *this)

{
  _Head_base<0UL,_duckdb::NodeStatistics_*,_false> _Var1;
  
  (this->super_TableFunctionData).super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__CTableBindData_02468ab8;
  if ((this->bind_data != (void *)0x0) && (this->delete_callback != (duckdb_delete_callback_t)0x0))
  {
    (*this->delete_callback)(this->bind_data);
  }
  this->bind_data = (void *)0x0;
  this->delete_callback = (duckdb_delete_callback_t)0x0;
  _Var1._M_head_impl =
       (this->stats).
       super_unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>._M_t.
       super___uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>
       .super__Head_base<0UL,_duckdb::NodeStatistics_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (NodeStatistics *)0x0) {
    operator_delete(_Var1._M_head_impl);
  }
  (this->stats).
  super_unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>._M_t.
  super___uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>.
  super__Head_base<0UL,_duckdb::NodeStatistics_*,_false>._M_head_impl = (NodeStatistics *)0x0;
  TableFunctionData::~TableFunctionData(&this->super_TableFunctionData);
  return;
}

Assistant:

~CTableBindData() override {
		if (bind_data && delete_callback) {
			delete_callback(bind_data);
		}
		bind_data = nullptr;
		delete_callback = nullptr;
	}